

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_interface.c
# Opt level: O3

dlep_router_if * dlep_router_add_interface(char *ifname)

{
  int iVar1;
  avl_tree *paVar2;
  long lVar3;
  undefined8 uVar4;
  dlep_router_if *interf;
  ulong uVar5;
  char *pcVar6;
  
  paVar2 = dlep_if_get_tree(false);
  lVar3 = avl_find(paVar2,ifname);
  if (lVar3 == 0) {
    interf = (dlep_router_if *)oonf_class_malloc(&_router_if_class);
    if (interf != (dlep_router_if *)0x0) {
      iVar1 = dlep_if_add((dlep_if *)interf,ifname,&_l2_origin,&_l2_default_origin,
                          _connect_to_if_changed,LOG_DLEP_ROUTER,false);
      if (iVar1 == 0) {
        (interf->_connect_to_watchdog).class = &_connect_to_watchdog_class;
        uVar5 = (ulong)LOG_DLEP_ROUTER;
        if (((&log_global_mask)[uVar5] & 1) == 0) {
          return interf;
        }
        pcVar6 = "Add session %s";
        uVar4 = 0xd5;
        goto LAB_0011f2ee;
      }
      oonf_class_free(&_router_if_class,interf);
    }
    interf = (dlep_router_if *)0x0;
  }
  else {
    interf = (dlep_router_if *)(lVar3 + -0xb50);
    uVar5 = (ulong)LOG_DLEP_ROUTER;
    if (((&log_global_mask)[uVar5] & 1) == 0) {
      return interf;
    }
    pcVar6 = "use existing instance for %s";
    uVar4 = 0xc4;
LAB_0011f2ee:
    oonf_log(1,uVar5,"src/generic/dlep/router/dlep_router_interface.c",uVar4,0,0,pcVar6,ifname);
  }
  return interf;
}

Assistant:

struct dlep_router_if *
dlep_router_add_interface(const char *ifname) {
  struct dlep_router_if *interface;

  interface = dlep_router_get_by_layer2_if(ifname);
  if (interface) {
    OONF_DEBUG(LOG_DLEP_ROUTER, "use existing instance for %s", ifname);
    return interface;
  }

  interface = oonf_class_malloc(&_router_if_class);
  if (!interface) {
    return NULL;
  }

  if (dlep_if_add(&interface->interf, ifname, &_l2_origin, &_l2_default_origin, _connect_to_if_changed, LOG_DLEP_ROUTER, false)) {
    oonf_class_free(&_router_if_class, interface);
    return NULL;
  }

  /* prepare timer */
  interface->_connect_to_watchdog.class = &_connect_to_watchdog_class;

  OONF_DEBUG(LOG_DLEP_ROUTER, "Add session %s", ifname);
  return interface;
}